

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_M4X3(Context *ctx)

{
  char local_218 [8];
  char code [256];
  char row2 [64];
  char row1 [64];
  char row0 [64];
  char src0 [64];
  Context *ctx_local;
  
  make_GLSL_srcarg_string_full(ctx,0,row0 + 0x38,0x40);
  make_GLSL_srcarg_string_full(ctx,1,row1 + 0x38,0x40);
  make_GLSL_srcarg_string_full(ctx,2,row2 + 0x38,0x40);
  make_GLSL_srcarg_string_full(ctx,3,code + 0xf8,0x40);
  make_GLSL_destarg_assign
            (ctx,local_218,0x100,"vec3(dot(%s, %s), dot(%s, %s), dot(%s, %s))",row0 + 0x38,
             row1 + 0x38,row0 + 0x38,row2 + 0x38,row0 + 0x38,code + 0xf8);
  output_line(ctx,"%s",local_218);
  return;
}

Assistant:

static void emit_GLSL_M4X3(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
    char row0[64]; make_GLSL_srcarg_string_full(ctx, 1, row0, sizeof (row0));
    char row1[64]; make_GLSL_srcarg_string_full(ctx, 2, row1, sizeof (row1));
    char row2[64]; make_GLSL_srcarg_string_full(ctx, 3, row2, sizeof (row2));
    char code[256];
    make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                "vec3(dot(%s, %s), dot(%s, %s), dot(%s, %s))",
                                src0, row0, src0, row1, src0, row2);
    output_line(ctx, "%s", code);
}